

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

void spvc_compiler_set_member_decoration_string
               (spvc_compiler compiler,spvc_type_id id,uint member_index,SpvDecoration decoration,
               char *argument)

{
  Compiler *this;
  allocator local_49;
  string local_48;
  
  this = (compiler->compiler)._M_t.
         super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>.
         _M_t.
         super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
         .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_48,argument,&local_49);
  spirv_cross::Compiler::set_member_decoration_string
            (this,(TypeID)id,member_index,decoration,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void spvc_compiler_set_member_decoration_string(spvc_compiler compiler, spvc_type_id id, unsigned member_index,
                                                SpvDecoration decoration, const char *argument)
{
	compiler->compiler->set_member_decoration_string(id, member_index, static_cast<spv::Decoration>(decoration),
	                                                 argument);
}